

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall CommandLineOptions::CommandLineOptions(CommandLineOptions *this)

{
  (this->comment)._M_dataplus._M_p = (pointer)&(this->comment).field_2;
  (this->comment)._M_string_length = 0;
  (this->comment).field_2._M_local_buf[0] = '\0';
  (this->delimiter)._M_dataplus._M_p = (pointer)&(this->delimiter).field_2;
  (this->delimiter)._M_string_length = 0;
  (this->delimiter).field_2._M_local_buf[0] = '\0';
  (this->fileInput)._M_dataplus._M_p = (pointer)&(this->fileInput).field_2;
  (this->fileInput)._M_string_length = 0;
  (this->fileInput).field_2._M_local_buf[0] = '\0';
  (this->fileOutput)._M_dataplus._M_p = (pointer)&(this->fileOutput).field_2;
  (this->fileOutput)._M_string_length = 0;
  (this->fileOutput).field_2._M_local_buf[0] = '\0';
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->sampling).mode = DEFAULT;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->filterRows)._stringFilters.
  super__Vector_base<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filterRows)._stringFilters.
  super__Vector_base<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filterRows)._stringFilters.
  super__Vector_base<DataFilters::StringFilterCase,_std::allocator<DataFilters::StringFilterCase>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->filterRows)._numericFilters.
  super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filterRows)._numericFilters.
  super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filterRows)._numericFilters.
  super__Vector_base<DataFilters::NumericFilterCase,_std::allocator<DataFilters::NumericFilterCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sampling).step = 1;
  (this->statisticsOptions).histogramOptions.binCount = 100;
  (this->statisticsOptions).histogramOptions.cacheSize = 1000;
  (this->statisticsOptions).histogramOptions.enabled = false;
  (this->statisticsOptions).doVar = false;
  (this->statisticsOptions).doCov = false;
  (this->statisticsOptions).doMax = false;
  (this->statisticsOptions).doMean = false;
  (this->statisticsOptions).doMin = false;
  this->blankEOF = false;
  std::__cxx11::string::_M_replace((string *)&this->comment,0,0,"",0);
  std::__cxx11::string::_M_replace
            ((string *)&this->delimiter,0,(this->delimiter)._M_string_length,"",0);
  std::__cxx11::string::_M_replace
            ((string *)&this->fileInput,0,(this->fileInput)._M_string_length,"",0);
  std::__cxx11::string::_M_replace
            ((string *)&this->fileOutput,0,(this->fileOutput)._M_string_length,"",0);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->filterColumns).super__Bvector_base<std::allocator<bool>_>);
  this->headerRow = 0;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(undefined8 *)
   &(this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  (this->filterColumns).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  this->numLinesToKeep = 0x7fffffff;
  this->numLinesToReshape = 1;
  this->numLinesToSkip = 0;
  this->removeDuplicates = false;
  this->seed = 1;
  this->showCorrelation = false;
  this->showCovariance = false;
  this->showHistogram = false;
  this->showFilteredData = false;
  this->strictParsing = false;
  this->verboseLevel = '\0';
  this->showFilteredData = false;
  this->showLeastSquaresOffset = false;
  this->showLeastSquaresSlope = false;
  this->showStatistics = false;
  return;
}

Assistant:

CommandLineOptions()
    {
        this->blankEOF = false;
        this->comment = "";
        this->delimiter = "";
        this->fileInput = "";
        this->fileOutput = "";
        this->filterColumns = std::vector<bool>();
        this->headerRow = 0;
        this->numLinesToKeep = std::numeric_limits<int>::max();
        this->numLinesToReshape = 1;
        this->numLinesToSkip = 0;
        this->removeDuplicates = false;
        this->seed = 1;
        this->showCorrelation = false;
        this->showCovariance = false;
        this->showFilteredData = false;
        this->showHistogram = false;
        this->showLeastSquaresOffset = false;
        this->showLeastSquaresSlope = false;
        this->showStatistics = false;
        this->strictParsing = false;
        this->verboseLevel = 0;
    }